

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O3

void __thiscall
ConfidentialAssetId_Constractor_Test::TestBody(ConfidentialAssetId_Constractor_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  ConfidentialAssetId assetid;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  ByteData local_78;
  string local_60;
  AssertHelper local_40;
  ConfidentialAssetId local_38;
  
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_38);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_60,&local_38);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_78,"assetid.GetHex().c_str()","\"\"",
             (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),"");
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
  }
  if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      pcVar3 = *(char **)local_78.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x12,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                       (char)local_60._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_60,&local_38);
  local_88.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)&local_60);
  local_40.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_78,"assetid.GetData().GetDataSize()","0",(unsigned_long *)&local_88,
             (int *)&local_40);
  if ((void *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p
                                    ));
  }
  if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_78.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x13,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                       (char)local_60._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (internal)cfd::core::ConfidentialAssetId::HasBlinding(&local_38);
  local_88.data_ = local_88.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_60,"assetid.HasBlinding()","false",(bool *)&local_78,
             (bool *)&local_88);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x14,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT71(local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                 local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_78.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           local_78.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_78.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_78.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::GetUnblindedData(&local_78,&local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_60,&local_78);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"assetid.GetUnblindedData().GetHex().c_str()","\"\"",
             (char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
  }
  if ((void *)CONCAT71(local_78.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_78.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_78.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_88.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_80.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                       (char)local_60._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (internal)cfd::core::ConfidentialAssetId::IsEmpty(&local_38);
  local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_78,(AssertionResult *)"assetid.IsEmpty()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x16,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (local_88.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_88.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor) {
  ConfidentialAssetId assetid;

  EXPECT_STREQ(assetid.GetHex().c_str(), "");
  EXPECT_EQ(assetid.GetData().GetDataSize(), 0);
  EXPECT_EQ(assetid.HasBlinding(), false);
  EXPECT_STREQ(assetid.GetUnblindedData().GetHex().c_str(), "");
  EXPECT_TRUE(assetid.IsEmpty());
}